

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O2

void __thiscall
soplex::
SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::changeElement(SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *this,int i,int j,
               number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *val,bool scale)

{
  fpclass_type fVar1;
  int32_t iVar2;
  SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar3;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar4;
  Real eps;
  bool bVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  Item *this_00;
  long lVar9;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar10;
  undefined4 *puVar11;
  uint *puVar12;
  uint *puVar13;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar14;
  Item *this_01;
  byte bVar15;
  int j_local;
  int i_local;
  undefined1 local_238 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_230;
  uint local_228 [25];
  bool local_1c4;
  fpclass_type local_1c0;
  int32_t local_1bc;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1b0;
  uint local_130 [28];
  int local_c0;
  undefined1 local_bc;
  undefined8 local_b8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_b0;
  
  bVar15 = 0;
  if (-1 < (j | i)) {
    this_01 = (this->
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.theitem +
              (this->
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.thekey[i].idx;
    this_00 = (this->
              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.theitem +
              (this->
              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.thekey[j].idx;
    puVar12 = (uint *)val;
    puVar13 = (uint *)&local_1b0;
    for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
      *puVar13 = *puVar12;
      puVar12 = puVar12 + 1;
      puVar13 = puVar13 + 1;
    }
    local_1b0.m_backend.exp = (val->m_backend).exp;
    local_1b0.m_backend.neg = (val->m_backend).neg;
    local_1b0.m_backend.fpclass = (val->m_backend).fpclass;
    local_1b0.m_backend.prec_elem = (val->m_backend).prec_elem;
    j_local = j;
    i_local = i;
    std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)local_238,
               &(this->_tolerances).
                super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
    eps = Tolerances::epsilon((Tolerances *)local_238);
    bVar5 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                      (&local_1b0,eps);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_230);
    if (bVar5) {
      local_228[0x14] = 0;
      local_228[0x15] = 0;
      local_228[0x16] = 0;
      local_228[0x17] = 0;
      local_228[0x10] = 0;
      local_228[0x11] = 0;
      local_228[0x12] = 0;
      local_228[0x13] = 0;
      local_228[0xc] = 0;
      local_228[0xd] = 0;
      local_228[0xe] = 0;
      local_228[0xf] = 0;
      local_228[8] = 0;
      local_228[9] = 0;
      local_228[10] = 0;
      local_228[0xb] = 0;
      local_228[4] = 0;
      local_228[5] = 0;
      local_228[6] = 0;
      local_228[7] = 0;
      local_228[0] = 0;
      local_228[1] = 0;
      local_228[2] = 0;
      local_228[3] = 0;
      local_238 = (undefined1  [8])0x0;
      _Stack_230._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if (scale) {
        pSVar3 = this->lp_scaler;
        pnVar10 = val;
        puVar12 = local_130;
        for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
          *puVar12 = (pnVar10->m_backend).data._M_elems[0];
          pnVar10 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar10 + ((ulong)bVar15 * -2 + 1) * 4);
          puVar12 = puVar12 + (ulong)bVar15 * -2 + 1;
        }
        local_c0 = (val->m_backend).exp;
        local_bc = (val->m_backend).neg;
        local_b8._0_4_ = (val->m_backend).fpclass;
        local_b8._4_4_ = (val->m_backend).prec_elem;
        val = &local_b0;
        (*pSVar3->_vptr_SPxScaler[0x2a])(val,pSVar3,this,i,(ulong)(uint)j);
      }
      pnVar10 = val;
      puVar12 = (uint *)local_238;
      for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
        *puVar12 = (pnVar10->m_backend).data._M_elems[0];
        pnVar10 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar10 + ((ulong)bVar15 * -2 + 1) * 4);
        puVar12 = puVar12 + (ulong)bVar15 * -2 + 1;
      }
      iVar6 = (val->m_backend).exp;
      bVar5 = (val->m_backend).neg;
      fVar1 = (val->m_backend).fpclass;
      iVar2 = (val->m_backend).prec_elem;
      local_228[0x18] = iVar6;
      local_1c4 = bVar5;
      local_1c0 = fVar1;
      local_1bc = iVar2;
      iVar8 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::pos((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)this_01,j);
      if ((iVar8 < 0) ||
         (iVar8 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::pos((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)this_00,i), iVar8 < 0)) {
        LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::add2(&this->
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ,i,1,&j_local,
               (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)local_238);
        LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::add2(&this->
                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ,j_local,1,&i_local,
               (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)local_238);
      }
      else {
        iVar8 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::pos((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)this_01,j);
        pNVar4 = (this_01->data).
                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .m_elem;
        puVar11 = (undefined4 *)local_238;
        pNVar14 = pNVar4 + iVar8;
        for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
          (pNVar14->val).m_backend.data._M_elems[0] = *puVar11;
          puVar11 = puVar11 + (ulong)bVar15 * -2 + 1;
          pNVar14 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)((long)pNVar14 + ((ulong)bVar15 * -2 + 1) * 4);
        }
        pNVar4[iVar8].val.m_backend.exp = iVar6;
        pNVar4[iVar8].val.m_backend.neg = bVar5;
        pNVar4[iVar8].val.m_backend.fpclass = fVar1;
        pNVar4[iVar8].val.m_backend.prec_elem = iVar2;
        iVar8 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::pos((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)this_00,i);
        pNVar4 = (this_00->data).
                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .m_elem;
        puVar12 = (uint *)local_238;
        pNVar14 = pNVar4 + iVar8;
        for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
          (pNVar14->val).m_backend.data._M_elems[0] = *puVar12;
          puVar12 = puVar12 + (ulong)bVar15 * -2 + 1;
          pNVar14 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)((long)pNVar14 + ((ulong)bVar15 * -2 + 1) * 4);
        }
        pNVar4[iVar8].val.m_backend.exp = iVar6;
        pNVar4[iVar8].val.m_backend.neg = bVar5;
        pNVar4[iVar8].val.m_backend.fpclass = fVar1;
        pNVar4[iVar8].val.m_backend.prec_elem = iVar2;
      }
    }
    else {
      iVar6 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::pos((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)this_01,j);
      if ((-1 < iVar6) &&
         (iVar6 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::pos((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)this_00,i), -1 < iVar6)) {
        uVar7 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::pos((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)this_01,j);
        SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::remove((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)this_01,(char *)(ulong)uVar7);
        uVar7 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::pos((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)this_00,i);
        SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::remove((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)this_00,(char *)(ulong)uVar7);
      }
    }
  }
  return;
}

Assistant:

virtual void changeElement(int i, int j, const R& val, bool scale = false)
   {
      if(i < 0 || j < 0)
         return;

      SVectorBase<R>& row = rowVector_w(i);
      SVectorBase<R>& col = colVector_w(j);

      if(isNotZero(val, this->tolerances()->epsilon()))
      {
         R newVal;

         if(scale)
         {
            assert(_isScaled);
            assert(lp_scaler);
            newVal = lp_scaler->scaleElement(*this, i, j, val);
         }
         else
            newVal = val;

         if(row.pos(j) >= 0 && col.pos(i) >= 0)
         {
            row.value(row.pos(j)) = newVal;
            col.value(col.pos(i)) = newVal;
         }
         else
         {
            LPRowSetBase<R>::add2(i, 1, &j, &newVal);
            LPColSetBase<R>::add2(j, 1, &i, &newVal);
         }
      }
      else if(row.pos(j) >= 0 && col.pos(i) >= 0)
      {
         row.remove(row.pos(j));
         col.remove(col.pos(i));
      }

      assert(isConsistent());
   }